

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap2Local.cpp
# Opt level: O1

bool __thiscall
wasm::anon_unknown_23::EscapeAnalyzer::escapes(EscapeAnalyzer *this,Expression *allocation)

{
  Id IVar1;
  BranchTargets *this_00;
  _Hash_node_base curr;
  size_t sVar2;
  Name name;
  bool bVar3;
  Expression *pEVar4;
  key_type pLVar5;
  Expression **ppEVar6;
  Expression *pEVar7;
  SetInfluences *pSVar8;
  __node_base _Var9;
  mapped_type *pmVar10;
  size_type sVar11;
  uint uVar12;
  anon_class_8_1_ba1d7401 *paVar13;
  long lVar14;
  _Rb_tree_node_base *p_Var15;
  _Hashtable<wasm::LocalSet_*,_wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *expr;
  _Hash_node_base *p_Var16;
  ulong uVar17;
  Switch *cast;
  mapped_type mVar18;
  _Hash_node_base *p_Var19;
  __node_base *p_Var20;
  ulong uVar21;
  bool bVar22;
  pair<wasm::Expression_*,_wasm::Expression_*> item;
  pair<wasm::Expression_*,_wasm::Expression_*> item_00;
  pair<wasm::Expression_*,_wasm::Expression_*> item_01;
  pair<wasm::Expression_*,_wasm::Expression_*> item_02;
  anon_class_16_2_3f140c08 func;
  undefined1 auStack_1b8 [8];
  UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_> flows;
  undefined1 local_f0 [24];
  __hashtable *__h;
  LocalGet *get;
  __buckets_ptr local_c8;
  _Rb_tree_const_iterator<wasm::LocalSet_*> local_c0;
  undefined1 local_b8 [8];
  unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
  gets;
  Expression *local_78;
  Expression *child;
  Expression *parent;
  key_type local_60;
  undefined1 auStack_58 [8];
  LocalSet *set;
  size_type local_48;
  _Rb_tree_const_iterator<wasm::LocalSet_*> local_40;
  
  flows.super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>.data.c.
  super__Deque_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  flows.super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>.data.c.
  super__Deque_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  flows.super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>.data.c.
  super__Deque_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  flows.super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>.data.c.
  super__Deque_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  flows.super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>.data.c.
  super__Deque_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  flows.super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>.data.c.
  super__Deque_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  flows.super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>.data.c.
  super__Deque_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  flows.super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>.data.c.
  super__Deque_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  auStack_1b8 = (undefined1  [8])0x0;
  flows.super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>.data.c.
  super__Deque_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  std::
  _Deque_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>
  ::_M_initialize_map((_Deque_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>
                       *)auStack_1b8,0);
  flows.super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>.data.c.
  super__Deque_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node =
       (_Map_pointer)
       &flows.super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>.count.
        _M_h._M_rehash_policy._M_next_resize;
  flows.super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>.count._M_h.
  _M_buckets = (__buckets_ptr)0x1;
  flows.super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>.count._M_h.
  _M_bucket_count = 0;
  flows.super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>.count._M_h.
  _M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  flows.super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>.count._M_h.
  _M_element_count._0_4_ = 0x3f800000;
  flows.super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>.count._M_h.
  _M_rehash_policy._M_max_load_factor = 0.0;
  flows.super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>.count._M_h.
  _M_rehash_policy._4_4_ = 0;
  flows.super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>.count._M_h.
  _M_rehash_policy._M_next_resize = 0;
  flows.super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>.count._M_h.
  _M_single_bucket = (__node_base_ptr)&flows.processed._M_h._M_rehash_policy._M_next_resize;
  flows.processed._M_h._M_buckets = (__buckets_ptr)0x1;
  flows.processed._M_h._M_bucket_count = 0;
  flows.processed._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  flows.processed._M_h._M_element_count._0_4_ = 0x3f800000;
  flows.processed._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  flows.processed._M_h._M_rehash_policy._4_4_ = 0;
  flows.processed._M_h._M_rehash_policy._M_next_resize = 0;
  pEVar4 = Parents::getParent(this->parents,allocation);
  item.second = pEVar4;
  item.first = allocation;
  UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>::push
            ((UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_> *)
             auStack_1b8,item);
  local_f0._16_8_ = &this->sets;
  parent = (Expression *)&this->reachedInteractions;
  local_f0._8_8_ = allocation;
  do {
    if (((long)((long)flows.
                      super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>.
                      data.c.
                      super__Deque_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_first -
               flows.super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>.
               data.c.
               super__Deque_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>
               ._M_impl.super__Deque_impl_data._M_map_size) >> 4) +
        ((long)flows.super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>.
               data.c.
               super__Deque_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node -
         (long)flows.super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>.
               data.c.
               super__Deque_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur >> 4) +
        ((((ulong)((long)flows.
                         super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>
                         .data.c.
                         super__Deque_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_last -
                  (long)flows.
                        super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>
                        .data.c.
                        super__Deque_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_last) >> 3) - 1) +
        (ulong)(flows.super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>.
                data.c.
                super__Deque_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last == (_Elt_pointer)0x0)) * 0x20 == 0
       ) {
      local_b8 = (undefined1  [8])&gets._M_h._M_rehash_policy._M_next_resize;
      gets._M_h._M_buckets = (__buckets_ptr)0x1;
      gets._M_h._M_bucket_count = 0;
      gets._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      gets._M_h._M_element_count = CONCAT44(gets._M_h._M_element_count._4_4_,0x3f800000);
      gets._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      gets._M_h._M_rehash_policy._4_4_ = 0;
      gets._M_h._M_rehash_policy._M_next_resize = 0;
      p_Var19 = (this->sets)._M_h._M_before_begin._M_nxt;
      if (p_Var19 != (_Hash_node_base *)0x0) {
        do {
          pSVar8 = LazyLocalGraph::getSetInfluences(this->localGraph,(LocalSet *)p_Var19[1]._M_nxt);
          for (p_Var16 = (pSVar8->_M_h)._M_before_begin._M_nxt; p_Var16 != (_Hash_node_base *)0x0;
              p_Var16 = p_Var16->_M_nxt) {
            __h = (__hashtable *)p_Var16[1]._M_nxt;
            auStack_58 = (undefined1  [8])local_b8;
            std::
            _Hashtable<wasm::LocalGet*,wasm::LocalGet*,std::allocator<wasm::LocalGet*>,std::__detail::_Identity,std::equal_to<wasm::LocalGet*>,std::hash<wasm::LocalGet*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<wasm::LocalGet*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::LocalGet*,false>>>>
                      ((_Hashtable<wasm::LocalGet*,wasm::LocalGet*,std::allocator<wasm::LocalGet*>,std::__detail::_Identity,std::equal_to<wasm::LocalGet*>,std::hash<wasm::LocalGet*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)auStack_58,&__h,auStack_58);
          }
          p_Var19 = p_Var19->_M_nxt;
        } while (p_Var19 != (_Hash_node_base *)0x0);
      }
      bVar22 = gets._M_h._M_bucket_count == 0;
      if (!bVar22) {
        bVar22 = false;
        pEVar4 = (Expression *)gets._M_h._M_bucket_count;
        do {
          parent = pEVar4;
          __h = (__hashtable *)
                LazyLocalGraph::getSets(this->localGraph,(LocalGet *)(pEVar4->type).id);
          sVar2 = (((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                     *)__h)->flexible)._M_t._M_impl.super__Rb_tree_header._M_node_count;
          set._0_1_ = sVar2 == 0;
          local_40._M_node = (_Rb_tree_node_base *)0x0;
          if ((bool)(char)set) {
            local_48 = 0;
          }
          else {
            local_40._M_node =
                 (((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                    *)__h)->flexible)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          }
          get = (LocalGet *)CONCAT71(get._1_7_,(char)set);
          local_c0._M_node = (_Base_ptr)0x0;
          auStack_58 = (undefined1  [8])__h;
          if (sVar2 == 0) {
            local_c8 = (__buckets_ptr)
                       (((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                          *)__h)->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.used;
          }
          else {
            local_c0._M_node =
                 &(((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                     *)__h)->flexible)._M_t._M_impl.super__Rb_tree_header._M_header;
          }
          while (bVar3 = SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                         ::
                         IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                         ::operator==((IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                                       *)auStack_58,(Iterator *)&__h), !bVar3) {
            p_Var15 = local_40._M_node + 1;
            if ((char)set != '\0') {
              p_Var15 = (_Rb_tree_node_base *)
                        ((((OrderedFixedStorage<wasm::LocalSet_*,_2UL> *)auStack_58)->
                         super_FixedStorageBase<wasm::LocalSet_*,_2UL>).storage._M_elems + local_48)
              ;
            }
            local_60 = *(key_type *)p_Var15;
            sVar11 = std::
                     _Hashtable<wasm::LocalSet_*,_wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::count((_Hashtable<wasm::LocalSet_*,_wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                              *)local_f0._16_8_,&local_60);
            if (sVar11 == 0) goto LAB_008c16ff;
            if ((char)set == '\x01') {
              local_48 = local_48 + 1;
            }
            else {
              local_40._M_node = (_Base_ptr)std::_Rb_tree_increment(local_40._M_node);
            }
          }
          pEVar4 = *(Expression **)parent;
          bVar22 = pEVar4 == (Expression *)0x0;
        } while (!bVar22);
      }
LAB_008c16ff:
      std::
      _Hashtable<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)local_b8);
      bVar22 = (bool)(bVar22 ^ 1);
      goto LAB_008c170f;
    }
    _local_78 = UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>
                ::pop((UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>
                       *)auStack_1b8);
    expr = (_Hashtable<wasm::LocalSet_*,_wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            *)local_78._8_8_;
    pLVar5 = (key_type)local_78;
    if (expr == (_Hashtable<wasm::LocalSet_*,_wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)0x0) {
      mVar18 = Escapes;
      goto LAB_008c11b3;
    }
    bVar22 = true;
    switch(*(Id *)&expr->_M_buckets) {
    case BlockId:
    case LoopId:
    case BreakId:
    case SwitchId:
    case LocalGetId:
    case LocalSetId:
      bVar22 = false;
      break;
    case IfId:
    case CallId:
    case CallIndirectId:
    case GlobalGetId:
    case GlobalSetId:
    case LoadId:
    case StoreId:
    case ConstId:
    case UnaryId:
    case BinaryId:
    case SelectId:
    case ReturnId:
    case MemorySizeId:
    case MemoryGrowId:
    case NopId:
    case UnreachableId:
    case AtomicRMWId:
    case AtomicCmpxchgId:
    case AtomicWaitId:
    case AtomicNotifyId:
    case AtomicFenceId:
    case SIMDExtractId:
    case SIMDReplaceId:
    case SIMDShuffleId:
    case SIMDTernaryId:
    case SIMDShiftId:
    case SIMDLoadId:
    case SIMDLoadStoreLaneId:
    case MemoryInitId:
    case DataDropId:
    case MemoryCopyId:
    case MemoryFillId:
    case PopId:
    case RefNullId:
    case RefFuncId:
    case TableGetId:
    case TableSetId:
    case TableSizeId:
    case TableGrowId:
    case TableFillId:
    case TableCopyId:
    case TableInitId:
    case TryId:
    case TryTableId:
    case ThrowId:
    case RethrowId:
    case ThrowRefId:
    case TupleMakeId:
    case TupleExtractId:
    case RefI31Id:
    case I31GetId:
    case CallRefId:
    case BrOnId:
    case StructNewId:
    case ArrayNewId:
    case ArrayNewDataId:
    case ArrayNewElemId:
    case ArrayNewFixedId:
    case ArrayLenId:
    case ArrayCopyId:
    case ArrayFillId:
    case ArrayInitDataId:
    case ArrayInitElemId:
    case StringNewId:
    case StringConstId:
    case StringMeasureId:
    case StringEncodeId:
    case StringConcatId:
    case StringEqId:
    case StringWTF16GetId:
    case StringSliceWTFId:
    case ContNewId:
    case ContBindId:
    case SuspendId:
    case ResumeId:
    case ResumeThrowId:
    case StackSwitchId:
      break;
    case DropId:
    case RefIsNullId:
    case RefEqId:
    case RefTestId:
    case StructGetId:
switchD_008c10a9_caseD_12:
      bVar3 = true;
      goto LAB_008c1510;
    case RefCastId:
      bVar3 = wasm::Type::isSubType
                        ((Type)((Type *)(local_f0._8_8_ + 8))->id,
                         (Type)((Type *)&expr->_M_bucket_count)->id);
      bVar3 = !bVar3;
LAB_008c1510:
      bVar22 = false;
      goto LAB_008c10ad;
    case StructSetId:
    case StructRMWId:
      bVar3 = (key_type)expr->_M_element_count == pLVar5;
      goto LAB_008c154d;
    case StructCmpxchgId:
      if (((key_type)expr->_M_element_count == pLVar5) ||
         (*(key_type *)&expr->_M_rehash_policy == pLVar5)) goto switchD_008c10a9_caseD_12;
      break;
    case ArrayGetId:
      bVar3 = *(char *)expr->_M_element_count == '\x0e';
LAB_008c154d:
      bVar22 = !bVar3;
      goto LAB_008c10ad;
    case ArraySetId:
      if (*(char *)expr->_M_element_count == '\x0e') {
        bVar3 = (key_type)(expr->_M_before_begin)._M_nxt == pLVar5;
        goto LAB_008c154d;
      }
      break;
    case RefAsId:
      bVar22 = *(int *)&(expr->_M_before_begin)._M_nxt != 0;
      break;
    default:
      handle_unreachable("unexpected expression type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                         ,0x46);
    }
    bVar3 = false;
LAB_008c10ad:
    mVar18 = bVar22 ^ FullyConsumes;
    if (((bVar22 == false) && (!bVar3)) &&
       (uVar17 = ((Type *)&expr->_M_bucket_count)->id, mVar18 = FullyConsumes,
       (uVar17 & 1) == 0 && 6 < uVar17)) {
      local_b8 = (undefined1  [8])expr;
      ppEVar6 = Properties::getImmediateFallthroughPtr
                          ((Expression **)local_b8,this->passOptions,this->wasm,AllowTeeBrIf);
      if ((key_type)*ppEVar6 == pLVar5) {
        mVar18 = Flows;
      }
      else {
        this_00 = this->branchTargets;
        auStack_58 = (undefined1  [8])0x0;
        set._0_1_ = '\0';
        set._1_7_ = 0;
        BranchUtils::
        operateOnScopeNameDefs<wasm::BranchUtils::getDefinedName(wasm::Expression*)::_lambda(wasm::Name&)_1_>
                  ((Expression *)expr,(Name *)auStack_58);
        paVar13 = (anon_class_8_1_ba1d7401 *)CONCAT71(set._1_7_,(char)set);
        name.super_IString.str._M_str._0_1_ = (char)set;
        name.super_IString.str._M_len = (size_t)auStack_58;
        name.super_IString.str._M_str._1_7_ = set._1_7_;
        BranchUtils::BranchTargets::getBranches
                  ((unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>
                    *)local_b8,this_00,name);
        mVar18 = Mixes;
        if (gets._M_h._M_before_begin._M_nxt == (_Hash_node_base *)0x1) {
          __h = *(__hashtable **)(gets._M_h._M_bucket_count + 8);
          local_60 = (key_type)0x0;
          auStack_58 = (undefined1  [8])&local_60;
          func.func = paVar13;
          func.expr = (Expression **)auStack_58;
          BranchUtils::
          operateOnScopeNameUses<wasm::BranchUtils::operateOnScopeNameUsesAndSentValues<wasm::BranchUtils::getSentValue(wasm::Expression*)::_lambda(wasm::Name,wasm::Expression*)_1_>(wasm::Expression*,wasm::BranchUtils::getSentValue(wasm::Expression*)::_lambda(wasm::Name,wasm::Expression*)_1_)::_lambda(wasm::Name&)_1_>
                    ((BranchUtils *)__h,(Expression *)&__h,func);
          if (local_60 == pLVar5) {
            if (*(Id *)&expr->_M_buckets == BlockId) {
              sVar2 = (expr->_M_rehash_policy)._M_next_resize;
              if (sVar2 == 0) {
                __assert_fail("usedElements > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                              ,0xd0,
                              "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::back() const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                             );
              }
              mVar18 = Flows;
              if (*(long *)(*(long *)(*(long *)&expr->_M_rehash_policy + -8 + sVar2 * 8) + 8) == 1)
              goto LAB_008c11a2;
            }
            mVar18 = Mixes;
          }
        }
LAB_008c11a2:
        std::
        _Hashtable<wasm::Expression_*,_wasm::Expression_*,_std::allocator<wasm::Expression_*>,_std::__detail::_Identity,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<wasm::Expression_*,_wasm::Expression_*,_std::allocator<wasm::Expression_*>,_std::__detail::_Identity,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)local_b8);
      }
    }
LAB_008c11b3:
    uVar12 = (uint)mVar18;
    if ((mVar18 != Escapes) && (uVar12 != 3)) {
      if (1 < (byte)(mVar18 - FullyConsumes)) {
        __assert_fail("interaction == ParentChildInteraction::FullyConsumes || interaction == ParentChildInteraction::Flows"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Heap2Local.cpp"
                      ,0x10b,
                      "bool wasm::(anonymous namespace)::EscapeAnalyzer::escapes(Expression *)");
      }
      gets._M_h._M_single_bucket._4_4_ = uVar12;
      if (mVar18 == Flows) {
        pEVar4 = child;
        pEVar7 = Parents::getParent(this->parents,child);
        item_00.second = pEVar7;
        item_00.first = pEVar4;
        UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>::push
                  ((UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>
                    *)auStack_1b8,item_00);
      }
      pEVar4 = child;
      auStack_58 = (undefined1  [8])
                   (SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                    *)0x0;
      if (child->_id == LocalSetId) {
        auStack_58 = (undefined1  [8])child;
      }
      if (auStack_58 != (undefined1  [8])0x0) {
        local_b8 = (undefined1  [8])local_f0._16_8_;
        std::
        _Hashtable<wasm::LocalSet*,wasm::LocalSet*,std::allocator<wasm::LocalSet*>,std::__detail::_Identity,std::equal_to<wasm::LocalSet*>,std::hash<wasm::LocalSet*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<wasm::LocalSet*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::LocalSet*,false>>>>
                  ((_Hashtable<wasm::LocalSet*,wasm::LocalSet*,std::allocator<wasm::LocalSet*>,std::__detail::_Identity,std::equal_to<wasm::LocalSet*>,std::hash<wasm::LocalSet*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_f0._16_8_,auStack_58,local_b8);
        pSVar8 = LazyLocalGraph::getSetInfluences(this->localGraph,(LocalSet *)auStack_58);
        p_Var20 = &(pSVar8->_M_h)._M_before_begin;
        while (p_Var20 = p_Var20->_M_nxt, p_Var20 != (__node_base *)0x0) {
          curr._M_nxt = p_Var20[1]._M_nxt;
          pEVar7 = Parents::getParent(this->parents,(Expression *)curr._M_nxt);
          item_01.second = pEVar7;
          item_01.first = (Expression *)curr._M_nxt;
          UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>::push
                    ((UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>
                      *)auStack_1b8,item_01);
        }
      }
      local_f0._0_8_ = local_78;
      gets._M_h._M_buckets = (__buckets_ptr)((ulong)gets._M_h._M_buckets & 0xffffffff00000000);
      gets._M_h._M_bucket_count = 0;
      gets._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      gets._M_h._M_rehash_policy._4_4_ = 0;
      __h = (__hashtable *)local_f0;
      get = (LocalGet *)local_b8;
      local_60 = (key_type)pEVar4;
      auStack_58 = (undefined1  [8])&local_60;
      set._0_1_ = (char)&__h;
      set._1_7_ = (undefined7)((ulong)&__h >> 8);
      IVar1 = pEVar4->_id;
      gets._M_h._M_before_begin._M_nxt = (_Hash_node_base *)&gets;
      gets._M_h._M_element_count = (size_type)&gets;
      if (IVar1 < RethrowId) {
        if (IVar1 < TryId) {
          if (IVar1 == BreakId) {
LAB_008c13f3:
            lVar14 = 0x10;
LAB_008c13f8:
            BranchUtils::anon_func::anon_class_16_2_3f140c08::operator()
                      ((anon_class_16_2_3f140c08 *)auStack_58,(Name *)(&pEVar4->_id + lVar14));
          }
          else if (IVar1 == SwitchId) {
            BranchUtils::anon_func::anon_class_16_2_3f140c08::operator()
                      ((anon_class_16_2_3f140c08 *)auStack_58,(Name *)(pEVar4 + 3));
            if (pEVar4[1].type.id != 0) {
              uVar17 = 0;
              uVar21 = 1;
              do {
                BranchUtils::anon_func::anon_class_16_2_3f140c08::operator()
                          ((anon_class_16_2_3f140c08 *)auStack_58,
                           (Name *)(uVar17 * 0x10 + *(long *)(pEVar4 + 1)));
                bVar22 = uVar21 < pEVar4[1].type.id;
                uVar17 = uVar21;
                uVar21 = (ulong)((int)uVar21 + 1);
              } while (bVar22);
            }
          }
          else if (IVar1 == InvalidId) {
LAB_008c176b:
            handle_unreachable("unexpected expression type",
                               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-delegations-fields.def"
                               ,0x103);
          }
        }
        else {
          lVar14 = 0x68;
          if (IVar1 == TryId) goto LAB_008c13f8;
          if ((IVar1 == TryTableId) && (*(long *)(pEVar4 + 4) != 0)) {
            uVar17 = 0;
            uVar21 = 1;
            do {
              BranchUtils::anon_func::anon_class_16_2_3f140c08::operator()
                        ((anon_class_16_2_3f140c08 *)auStack_58,
                         (Name *)(uVar17 * 0x10 + pEVar4[3].type.id));
              bVar22 = uVar21 < *(ulong *)(pEVar4 + 4);
              uVar17 = uVar21;
              uVar21 = (ulong)((int)uVar21 + 1);
            } while (bVar22);
          }
        }
      }
      else if (IVar1 < ResumeId) {
        if (IVar1 == RethrowId) goto LAB_008c13f3;
        if (IVar1 == BrOnId) {
          lVar14 = 0x18;
          goto LAB_008c13f8;
        }
      }
      else if (IVar1 == ResumeId) {
        if (pEVar4[3].type.id != 0) {
          uVar17 = 0;
          uVar21 = 1;
          do {
            BranchUtils::anon_func::anon_class_16_2_3f140c08::operator()
                      ((anon_class_16_2_3f140c08 *)auStack_58,
                       (Name *)(uVar17 * 0x10 + *(long *)(pEVar4 + 3)));
            bVar22 = uVar21 < pEVar4[3].type.id;
            uVar17 = uVar21;
            uVar21 = (ulong)((int)uVar21 + 1);
          } while (bVar22);
        }
      }
      else if (IVar1 == ResumeThrowId) {
        if (pEVar4[4].type.id != 0) {
          uVar17 = 0;
          uVar21 = 1;
          do {
            BranchUtils::anon_func::anon_class_16_2_3f140c08::operator()
                      ((anon_class_16_2_3f140c08 *)auStack_58,
                       (Name *)(uVar17 * 0x10 + *(long *)(pEVar4 + 4)));
            bVar22 = uVar21 < pEVar4[4].type.id;
            uVar17 = uVar21;
            uVar21 = (ulong)((int)uVar21 + 1);
          } while (bVar22);
        }
      }
      else if (IVar1 == NumExpressionIds) goto LAB_008c176b;
      if ((_Rb_tree_node_base *)gets._M_h._M_before_begin._M_nxt != (_Rb_tree_node_base *)&gets) {
        pEVar4 = local_78;
        _Var9._M_nxt = gets._M_h._M_before_begin._M_nxt;
        do {
          pEVar7 = BranchUtils::BranchTargets::getTarget
                             (this->branchTargets,(Name)*(string_view *)((long)_Var9._M_nxt + 0x20))
          ;
          item_02.second = pEVar7;
          item_02.first = pEVar4;
          UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>::push
                    ((UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>
                      *)auStack_1b8,item_02);
          _Var9._M_nxt = (_Hash_node_base *)std::_Rb_tree_increment(_Var9._M_nxt);
        } while ((_Rb_tree_node_base *)_Var9._M_nxt != (_Rb_tree_node_base *)&gets);
      }
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)local_b8);
      pmVar10 = std::
                unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::ParentChildInteraction,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>_>
                ::operator[]((unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::ParentChildInteraction,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>_>
                              *)parent,&stack0xffffffffffffff88);
      *pmVar10 = Flows;
      pmVar10 = std::
                unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::ParentChildInteraction,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>_>
                ::operator[]((unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::ParentChildInteraction,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>_>
                              *)parent,&child);
      *pmVar10 = mVar18;
      uVar12 = gets._M_h._M_single_bucket._4_4_;
    }
    if ((mVar18 == Escapes) || (uVar12 == 3)) {
      bVar22 = true;
LAB_008c170f:
      std::
      _Hashtable<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::Expression_*,_wasm::Expression_*>_>,_std::hash<std::pair<wasm::Expression_*,_wasm::Expression_*>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::Expression_*,_wasm::Expression_*>_>,_std::hash<std::pair<wasm::Expression_*,_wasm::Expression_*>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)&flows.
                        super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>
                        .count._M_h._M_single_bucket);
      std::
      _Hashtable<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::pair<const_std::pair<wasm::Expression_*,_wasm::Expression_*>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<wasm::Expression_*,_wasm::Expression_*>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::Expression_*,_wasm::Expression_*>_>,_std::hash<std::pair<wasm::Expression_*,_wasm::Expression_*>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::pair<const_std::pair<wasm::Expression_*,_wasm::Expression_*>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<wasm::Expression_*,_wasm::Expression_*>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::Expression_*,_wasm::Expression_*>_>,_std::hash<std::pair<wasm::Expression_*,_wasm::Expression_*>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)((long)&flows.
                               super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>
                               .data.c.
                               super__Deque_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>
                               ._M_impl.super__Deque_impl_data + 0x48));
      std::
      _Deque_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>
      ::~_Deque_base((_Deque_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>
                      *)auStack_1b8);
      return bVar22;
    }
  } while( true );
}

Assistant:

bool escapes(Expression* allocation) {
    // A queue of flows from children to parents. When something is in the queue
    // here then it assumed that it is ok for the allocation to be at the child
    // (that is, we have already checked the child before placing it in the
    // queue), and we need to check if it is ok to be at the parent, and to flow
    // from the child to the parent. We will analyze that (see
    // ParentChildInteraction, above) and continue accordingly.
    using ChildAndParent = std::pair<Expression*, Expression*>;
    UniqueNonrepeatingDeferredQueue<ChildAndParent> flows;

    // Start the flow from the allocation itself to its parent.
    flows.push({allocation, parents.getParent(allocation)});

    // Keep flowing while we can.
    while (!flows.empty()) {
      auto flow = flows.pop();
      auto* child = flow.first;
      auto* parent = flow.second;

      auto interaction = getParentChildInteraction(allocation, parent, child);
      if (interaction == ParentChildInteraction::Escapes ||
          interaction == ParentChildInteraction::Mixes) {
        // If the parent may let us escape, or the parent mixes other values
        // up with us, give up.
        return true;
      }

      // The parent either fully consumes us, or flows us onwards; either way,
      // we can proceed here, hopefully.
      assert(interaction == ParentChildInteraction::FullyConsumes ||
             interaction == ParentChildInteraction::Flows);

      // We can proceed, as the parent interacts with us properly, and we are
      // the only allocation to get here.

      if (interaction == ParentChildInteraction::Flows) {
        // The value flows through the parent; we need to look further at the
        // grandparent.
        flows.push({parent, parents.getParent(parent)});
      }

      if (auto* set = parent->dynCast<LocalSet>()) {
        // This is one of the sets we are written to, and so we must check for
        // exclusive use of our allocation by all the gets that read the value.
        // Note the set, and we will check the gets at the end once we know all
        // of our sets.
        sets.insert(set);

        // We must also look at how the value flows from those gets.
        for (auto* get : localGraph.getSetInfluences(set)) {
          flows.push({get, parents.getParent(get)});
        }
      }

      // If the parent may send us on a branch, we will need to look at the flow
      // to the branch target(s).
      for (auto name : branchesSentByParent(child, parent)) {
        flows.push({child, branchTargets.getTarget(name)});
      }

      // If we got to here, then we can continue to hope that we can optimize
      // this allocation. Mark the parent and child as reached by it, and
      // continue. The child flows the value to the parent, and the parent's
      // behavior was computed before.
      reachedInteractions[child] = ParentChildInteraction::Flows;
      reachedInteractions[parent] = interaction;
    }

    // We finished the loop over the flows. Do the final checks.
    if (!getsAreExclusiveToSets()) {
      return true;
    }

    // Nothing escapes, hurray!
    return false;
  }